

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FmaCase::getInputValues(FmaCase *this,int numValues,void **values)

{
  float maxValue;
  Precision precision;
  pointer pSVar1;
  void *pvVar2;
  deUint32 dVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int inputNdx_1;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int caseNdx_1;
  bool bVar13;
  float fVar14;
  Random rnd;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -127.0;
  local_58[3] = 127.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar3 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3 ^ 0xac23f);
  pSVar1 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  precision = (pSVar1->varType).m_data.basic.precision;
  uVar12 = (ulong)precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  iVar11 = 0;
  uVar5 = 0;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      uVar9 = uVar5;
      iVar8 = iVar11;
      while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
        *(undefined4 *)((long)values[lVar7] + (long)iVar8 * 4) = (&DAT_018a3340)[lVar6 * 3 + lVar7];
        iVar8 = iVar8 + 1;
      }
    }
    iVar11 = iVar11 + uVar4;
  }
  fVar14 = local_58[uVar12 * 2];
  maxValue = local_58[uVar12 * 2 + 1];
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    fillRandomScalars<float>
              ((Random *)&local_40,fVar14,maxValue,
               (void *)((long)values[lVar6] + (long)(int)(uVar4 * 10) * 4),(numValues + -10) * uVar4
               ,(int)uVar12);
  }
  lVar6 = 0;
  if (numValues < 1) {
    numValues = 0;
  }
  for (; lVar6 != 3; lVar6 = lVar6 + 1) {
    iVar11 = 0;
    for (iVar8 = 0; uVar12 = uVar5, iVar10 = iVar11, iVar8 != numValues; iVar8 = iVar8 + 1) {
      while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
        pvVar2 = values[lVar6];
        fVar14 = makeFloatRepresentable(*(float *)((long)pvVar2 + (long)iVar10 * 4),precision);
        *(float *)((long)pvVar2 + (long)iVar10 * 4) = fVar14;
        iVar10 = iVar10 + 1;
      }
      iVar11 = iVar11 + uVar4;
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-127.f,	127.f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd							(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const float				specialCases[][3]			=
		{
			// a		b		c
			{ 0.0f,		0.0f,	0.0f },
			{ 0.0f,		1.0f,	0.0f },
			{ 0.0f,		0.0f,	-1.0f },
			{ 1.0f,		1.0f,	0.0f },
			{ 1.0f,		1.0f,	1.0f },
			{ -1.0f,	1.0f,	0.0f },
			{ 1.0f,		-1.0f,	0.0f },
			{ -1.0f,	-1.0f,	0.0f },
			{ -0.0f,	1.0f,	0.0f },
			{ 1.0f,		-0.0f,	0.0f }
		};
		const int				numSpecialCases				= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
					((float*)values[inputNdx])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx][inputNdx];
			}
		}

		// Random cases.
		{
			const int	numScalars	= (numValues-numSpecialCases)*scalarSize;
			const int	offs		= scalarSize*numSpecialCases;

			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
				fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[inputNdx] + offs, numScalars);
		}

		// Make sure the values are representable in the target format
		for (int inputNdx = 0; inputNdx < 3; inputNdx++)
		{
			for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				{
					float* const valuePtr = &((float*)values[inputNdx])[caseNdx * scalarSize + scalarNdx];

					*valuePtr = makeFloatRepresentable(*valuePtr, precision);
				}
			}
		}
	}